

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceEditionsSupport
          (CommandLineInterface *this,string *codegen_name,uint64_t supported_features,
          Edition minimum_edition,Edition maximum_edition,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  pointer ppFVar1;
  FileDescriptor *this_00;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  size_type sVar5;
  bool bVar6;
  Edition edition;
  char *extraout_RDX;
  pointer ppFVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  string_view filename;
  string_view format;
  string_view format_00;
  string_view format_01;
  string result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  long local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  pointer local_d0;
  StringifySink local_c8;
  StringifySink local_a8;
  pointer local_88;
  string *local_80;
  size_type local_78;
  pointer local_70;
  size_type local_68;
  pointer local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  
  local_d0 = (pointer)CONCAT44(local_d0._4_4_,maximum_edition);
  if (this->experimental_editions_ == false) {
    ppFVar1 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_80 = codegen_name;
    for (ppFVar7 = (parsed_files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppFVar7 != ppFVar1;
        ppFVar7 = ppFVar7 + 1) {
      this_00 = *ppFVar7;
      edition = FileDescriptor::edition(this_00);
      if ((999 < (int)edition) &&
         (filename._M_str = extraout_RDX,
         filename._M_len = (size_t)(this_00->name_->_M_dataplus)._M_p,
         bVar6 = CanSkipEditionCheck((compiler *)this_00->name_->_M_string_length,filename), !bVar6)
         ) {
        if ((supported_features & 2) == 0) {
          local_70 = (this_00->name_->_M_dataplus)._M_p;
          local_78 = this_00->name_->_M_string_length;
          local_60 = (local_80->_M_dataplus)._M_p;
          local_68 = local_80->_M_string_length;
          local_e8 = 0;
          local_e0._M_local_buf[0] = '\0';
          format._M_str = (char *)&local_78;
          format._M_len =
               (size_t)
               "$0: is an editions file, but code generator $1 hasn\'t been updated to support editions yet.  Please ask the owner of this code generator to add support or switch back to proto2/proto3.\n\nSee https://protobuf.dev/editions/overview/ for more information."
          ;
          local_f0 = &local_e0;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)&local_f0,(Nonnull<std::string_*>)0xfb,format,
                     (Nullable<const_absl::string_view_*>)0x2,(size_t)parsed_files);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_f0->_M_local_buf,local_e8);
          if (local_f0 == &local_e0) {
            return false;
          }
          uVar8 = CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
          _Var9._M_p = (pointer)local_f0;
          goto LAB_0019151d;
        }
        if ((int)edition < (int)minimum_edition) {
          local_d0 = (this_00->name_->_M_dataplus)._M_p;
          sVar2 = this_00->name_->_M_string_length;
          local_88 = (local_80->_M_dataplus)._M_p;
          sVar4 = local_80->_M_string_length;
          local_a8.buffer_._M_dataplus._M_p = (pointer)&local_a8.buffer_.field_2;
          local_a8.buffer_.field_2._M_allocated_capacity = 0;
          local_a8.buffer_.field_2._8_8_ = 0;
          local_a8.buffer_._M_string_length = 0;
          AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_a8,edition);
          sVar5 = local_a8.buffer_._M_string_length;
          _Var9._M_p = local_a8.buffer_._M_dataplus._M_p;
          local_c8.buffer_._M_dataplus._M_p = (pointer)&local_c8.buffer_.field_2;
          local_c8.buffer_.field_2._M_allocated_capacity = 0;
          local_c8.buffer_.field_2._8_8_ = 0;
          local_c8.buffer_._M_string_length = 0;
          AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
                    (&local_c8,minimum_edition);
          local_f0 = &local_e0;
          local_e8 = 0;
          local_e0._M_local_buf[0] = '\0';
          local_70 = local_d0;
          local_60 = local_88;
          local_58 = sVar5;
          local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var9._M_p;
          local_48 = local_c8.buffer_._M_string_length;
          local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_c8.buffer_._M_dataplus._M_p;
          format_00._M_str = (char *)&local_78;
          format_00._M_len =
               (size_t)
               "$0: is a file using edition $2, which isn\'t supported by code generator $1.  Please upgrade your file to at least edition $3."
          ;
          local_78 = sVar2;
          local_68 = sVar4;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)&local_f0,(Nonnull<std::string_*>)0x7d,format_00,
                     (Nullable<const_absl::string_view_*>)0x4,(size_t)parsed_files);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_f0->_M_local_buf,local_e8);
        }
        else {
          if ((int)edition <= (int)(Edition)local_d0) goto LAB_0019124e;
          local_88 = (this_00->name_->_M_dataplus)._M_p;
          sVar2 = this_00->name_->_M_string_length;
          pcVar3 = (local_80->_M_dataplus)._M_p;
          sVar4 = local_80->_M_string_length;
          local_a8.buffer_._M_dataplus._M_p = (pointer)&local_a8.buffer_.field_2;
          local_a8.buffer_.field_2._M_allocated_capacity = 0;
          local_a8.buffer_.field_2._8_8_ = 0;
          local_a8.buffer_._M_string_length = 0;
          AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_a8,edition);
          sVar5 = local_a8.buffer_._M_string_length;
          _Var9._M_p = local_a8.buffer_._M_dataplus._M_p;
          local_c8.buffer_._M_dataplus._M_p = (pointer)&local_c8.buffer_.field_2;
          local_c8.buffer_.field_2._M_allocated_capacity = 0;
          local_c8.buffer_.field_2._8_8_ = 0;
          local_c8.buffer_._M_string_length = 0;
          AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
                    (&local_c8,(Edition)local_d0);
          local_f0 = &local_e0;
          local_e8 = 0;
          local_e0._M_local_buf[0] = '\0';
          local_70 = local_88;
          local_58 = sVar5;
          local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var9._M_p;
          local_48 = local_c8.buffer_._M_string_length;
          local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_c8.buffer_._M_dataplus._M_p;
          format_01._M_str = (char *)&local_78;
          format_01._M_len =
               (size_t)
               "$0: is a file using edition $2, which isn\'t supported by code generator $1.  Please ask the owner of this code generator to add support or switch back to a maximum of edition $3."
          ;
          local_78 = sVar2;
          local_68 = sVar4;
          local_60 = pcVar3;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)&local_f0,(Nonnull<std::string_*>)0xb2,format_01,
                     (Nullable<const_absl::string_view_*>)0x4,(size_t)parsed_files);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_f0->_M_local_buf,local_e8);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                            local_e0._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.buffer_._M_dataplus._M_p != &local_c8.buffer_.field_2) {
          operator_delete(local_c8.buffer_._M_dataplus._M_p,
                          local_c8.buffer_.field_2._M_allocated_capacity + 1);
        }
        uVar8 = local_a8.buffer_.field_2._M_allocated_capacity;
        _Var9._M_p = local_a8.buffer_._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.buffer_._M_dataplus._M_p == &local_a8.buffer_.field_2) {
          return false;
        }
LAB_0019151d:
        operator_delete(_Var9._M_p,uVar8 + 1);
        return false;
      }
LAB_0019124e:
    }
  }
  return true;
}

Assistant:

bool CommandLineInterface::EnforceEditionsSupport(
    const std::string& codegen_name, uint64_t supported_features,
    Edition minimum_edition, Edition maximum_edition,
    const std::vector<const FileDescriptor*>& parsed_files) const {
  if (experimental_editions_) {
    // The user has explicitly specified the experimental flag.
    return true;
  }
  for (const auto* fd : parsed_files) {
    Edition edition =
        ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd);
    if (edition < Edition::EDITION_2023 || CanSkipEditionCheck(fd->name())) {
      // Legacy proto2/proto3 or exempted files don't need any checks.
      continue;
    }

    if ((supported_features & CodeGenerator::FEATURE_SUPPORTS_EDITIONS) == 0) {
      std::cerr << absl::Substitute(
          "$0: is an editions file, but code generator $1 hasn't been "
          "updated to support editions yet.  Please ask the owner of this code "
          "generator to add support or switch back to proto2/proto3.\n\nSee "
          "https://protobuf.dev/editions/overview/ for more information.",
          fd->name(), codegen_name);
      return false;
    }
    if (edition < minimum_edition) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $2, which isn't supported by code "
          "generator $1.  Please upgrade your file to at least edition $3.",
          fd->name(), codegen_name, edition, minimum_edition);
      return false;
    }
    if (edition > maximum_edition) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $2, which isn't supported by code "
          "generator $1.  Please ask the owner of this code generator to add "
          "support or switch back to a maximum of edition $3.",
          fd->name(), codegen_name, edition, maximum_edition);
      return false;
    }
  }
  return true;
}